

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

ssize_t __thiscall
Jupiter::IRC::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Socket *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_len = CONCAT44(in_register_00000034,__fd);
  this_00 = (this->m_socket)._M_t.
            super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
            super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
            super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl;
  local_20._M_str = (char *)__buf;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_61);
  std::operator+(&local_60,&local_40,"\r\n");
  Socket::send(this_00,(int)local_60._M_string_length,local_60._M_dataplus._M_p,__n,__flags);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return extraout_RAX;
}

Assistant:

void Jupiter::IRC::Client::send(std::string_view rawMessage) {
	m_socket->send(static_cast<std::string>(rawMessage) + "\r\n");
}